

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chained_buffer.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::chained_buffer::append_buffer<libtorrent::disk_buffer_holder>
          (chained_buffer *this,disk_buffer_holder *buffer,int used_size)

{
  reference b_00;
  disk_buffer_holder local_40;
  reference local_28;
  buffer_t *b;
  disk_buffer_holder *pdStack_18;
  int used_size_local;
  disk_buffer_holder *buffer_local;
  chained_buffer *this_local;
  
  b._4_4_ = used_size;
  pdStack_18 = buffer;
  buffer_local = (disk_buffer_holder *)this;
  ::std::
  deque<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
  ::emplace_back<>(&this->m_vec);
  b_00 = ::std::
         deque<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
         ::back(&this->m_vec);
  local_28 = b_00;
  disk_buffer_holder::disk_buffer_holder(&local_40,buffer);
  init_buffer_entry<libtorrent::disk_buffer_holder>(this,b_00,&local_40,b._4_4_);
  disk_buffer_holder::~disk_buffer_holder(&local_40);
  return;
}

Assistant:

void append_buffer(Holder buffer, int used_size)
		{
			TORRENT_ASSERT(is_single_thread());
			TORRENT_ASSERT(int(buffer.size()) >= used_size);
			m_vec.emplace_back();
			buffer_t& b = m_vec.back();
			init_buffer_entry<Holder>(b, std::move(buffer), used_size);
		}